

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O2

void * align_pointer(void *ptr,size_t alignment)

{
  ulong uVar1;
  void *pvVar2;
  
  uVar1 = alignment - 1;
  if ((alignment & uVar1) != 0) {
    __assert_fail("alignment != 0 && (alignment & (alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/../internal.h"
                  ,0xb8,"void *align_pointer(void *, size_t)");
  }
  pvVar2 = (void *)((-(long)ptr & uVar1) + (long)ptr);
  if ((uVar1 & (ulong)pvVar2) == 0) {
    return pvVar2;
  }
  __assert_fail("((uintptr_t)ptr & (alignment - 1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/../internal.h"
                ,0xc0,"void *align_pointer(void *, size_t)");
}

Assistant:

static inline void *align_pointer(void *ptr, size_t alignment) {
  // |alignment| must be a power of two.
  assert(alignment != 0 && (alignment & (alignment - 1)) == 0);
  // Instead of aligning |ptr| as a |uintptr_t| and casting back, compute the
  // offset and advance in pointer space. C guarantees that casting from pointer
  // to |uintptr_t| and back gives the same pointer, but general
  // integer-to-pointer conversions are implementation-defined. GCC does define
  // it in the useful way, but this makes fewer assumptions.
  uintptr_t offset = (0u - (uintptr_t)ptr) & (alignment - 1);
  ptr = (char *)ptr + offset;
  assert(((uintptr_t)ptr & (alignment - 1)) == 0);
  return ptr;
}